

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

void anon_unknown.dwarf_6bac9::test_parts<float>
               (int pattern_number,int number_of_parts,bool load_depths,bool entire_buffer,
               string *tempDir)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pbVar4;
  pointer pHVar5;
  _Alloc_hider _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  ostream *poVar13;
  undefined4 *puVar14;
  data<float> *pdVar15;
  long lVar16;
  DeepScanLineInputPart *this;
  Box2i *pBVar17;
  pointer pvVar18;
  size_t c_1;
  ulong uVar19;
  ulong uVar20;
  data<float> *pdVar21;
  size_t i;
  long lVar22;
  string *psVar23;
  size_type sVar24;
  int iVar25;
  pointer *ppvVar26;
  long lVar27;
  data<float> *pdVar28;
  size_t s_1;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  data<float> *__cur;
  data<float> *pdVar32;
  int i_1;
  long lVar33;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *this_00;
  bool bVar34;
  data<float> main;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  allocator<char> local_2e9;
  size_type local_2e8;
  data<float> *local_2e0;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  sample_pointers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counts;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  sample_buffers;
  vector<float,_std::allocator<float>_> data;
  undefined1 local_208 [8];
  MultiPartOutputFile f;
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  local_1f0;
  data<float> *local_1d8;
  ulong local_1d0;
  string fn;
  ostringstream s;
  undefined1 local_1a0 [24];
  _Base_ptr local_188;
  size_t local_180;
  
  std::operator+(&fn,tempDir,"imf_test_composite_deep_scanline_source.exr");
  data<float>::data(&main);
  if (pattern_number == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"Z",(allocator<char> *)&sample_buffers);
    data<float>::operator<<(&main,(string *)&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,"ZBack",(allocator<char> *)&headers);
    data<float>::operator<<(&main,(string *)&data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&counts,"A",(allocator<char> *)&local_1f0);
    data<float>::operator<<(&main,(string *)&counts);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sample_pointers,"R",(allocator<char> *)&f);
    psVar23 = (string *)&sample_pointers;
    data<float>::operator<<(&main,psVar23);
    std::__cxx11::string::~string((string *)&sample_pointers);
    std::__cxx11::string::~string((string *)&counts);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::~string((string *)&s);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,2.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.1);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,3.1);
    data<float>::operator<<(&main,4.3);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,1.4);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,10.0);
    data<float>::operator<<(&main,20.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,20.0);
    data<float>::operator<<(&main,30.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,2.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,10.0);
    data<float>::operator<<(&main,20.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,(end *)psVar23);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"Z",(allocator<char> *)&headers)
    ;
    data<float>::operator<<(&main,(string *)&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,"R",(allocator<char> *)&local_1f0);
    data<float>::operator<<(&main,(string *)&data);
    std::__cxx11::string::string<std::allocator<char>>((string *)&counts,"G",(allocator<char> *)&f);
    data<float>::operator<<(&main,(string *)&counts);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sample_pointers,"B",(allocator<char> *)local_208);
    data<float>::operator<<(&main,(string *)&sample_pointers);
    std::__cxx11::string::string<std::allocator<char>>((string *)&sample_buffers,"A",&local_2e9);
    psVar23 = (string *)&sample_buffers;
    data<float>::operator<<(&main,psVar23);
    std::__cxx11::string::~string((string *)&sample_buffers);
    std::__cxx11::string::~string((string *)&sample_pointers);
    std::__cxx11::string::~string((string *)&counts);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::~string((string *)&s);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.2984);
    data<float>::operator<<(&main,0.688);
    data<float>::operator<<(&main,1.35908);
    data<float>::operator<<(&main,0.42896);
    data<float>::operator<<(&main,0.9817);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,2.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,5.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,11.0);
    data<float>::operator<<(&main,0.4);
    data<float>::operator<<(&main,1.25);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.7);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.2);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,-0.1);
    data<float>::operator<<(&main,0.0);
    data<float>::operator<<(&main,0.24);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,12.3);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,0.56);
    data<float>::operator<<(&main,2.26);
    data<float>::operator<<(&main,0.9);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,15.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,0.5);
    data<float>::operator<<(&main,0.6);
    data<float>::operator<<(&main,0.2);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,2.62319);
    data<float>::operator<<(&main,0.7005);
    data<float>::operator<<(&main,1.38387);
    data<float>::operator<<(&main,0.43678);
    data<float>::operator<<(&main,0.99967);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
    data<float>::operator<<(&main,(result *)psVar23);
    data<float>::operator<<(&main,27.0);
    data<float>::operator<<(&main,1.0);
    data<float>::operator<<(&main,-1.0);
    data<float>::operator<<(&main,42.0);
    data<float>::operator<<(&main,14.0);
    data<float>::operator<<(&main,(end *)psVar23);
  }
  _Var6._M_p = fn._M_dataplus._M_p;
  uVar20 = (ulong)(uint)number_of_parts;
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            (&headers,uVar20,(allocator_type *)&s);
  lVar11 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar11 + 8) = 0xa4;
  lVar11 = Imf_3_2::Header::displayWindow();
  *(undefined4 *)(lVar11 + 0xc) = 0xd8;
  iVar7 = random_int(400);
  piVar12 = (int *)Imf_3_2::Header::dataWindow();
  *piVar12 = iVar7 + -200;
  piVar12 = (int *)Imf_3_2::Header::dataWindow();
  iVar7 = *piVar12;
  iVar8 = random_int(400);
  lVar11 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar11 + 8) = iVar7 + iVar8 + 0x28;
  iVar7 = random_int(400);
  lVar11 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar11 + 4) = iVar7 + -200;
  lVar11 = Imf_3_2::Header::dataWindow();
  iVar7 = *(int *)(lVar11 + 4);
  iVar8 = random_int(400);
  lVar11 = Imf_3_2::Header::dataWindow();
  *(int *)(lVar11 + 0xc) = iVar7 + iVar8 + 0x28;
  poVar13 = std::operator<<((ostream *)&std::cout,"data window: ");
  piVar12 = (int *)Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*piVar12);
  poVar13 = std::operator<<(poVar13,',');
  lVar11 = Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)(lVar11 + 4));
  poVar13 = std::operator<<(poVar13,' ');
  lVar11 = Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)(lVar11 + 8));
  poVar13 = std::operator<<(poVar13,',');
  lVar11 = Imf_3_2::Header::dataWindow();
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(int *)(lVar11 + 0xc));
  std::endl<char,std::char_traits<char>>(poVar13);
  Imf_3_2::Header::setType
            ((string *)
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar14 = (undefined4 *)Imf_3_2::Header::compression();
  pHVar5 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  *puVar14 = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"Part0",(allocator<char> *)&data);
  local_2e0 = (data<float> *)_Var6._M_p;
  Imf_3_2::Header::setName((string *)pHVar5);
  std::__cxx11::string::~string((string *)&s);
  lVar33 = 0x38;
  for (lVar11 = 1; lVar11 < number_of_parts; lVar11 = lVar11 + 1) {
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + lVar33,
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar13 = std::operator<<((ostream *)&s,"Part");
    std::ostream::operator<<(poVar13,(int)lVar11);
    pHVar5 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::stringbuf::str();
    Imf_3_2::Header::setName((string *)(pHVar5 + lVar33));
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    lVar33 = lVar33 + 0x38;
  }
  pdVar15 = (data<float> *)operator_new(uVar20 * 0xa0);
  local_1f0.
  super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar15 + uVar20;
  local_1f0.
  super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pdVar15;
  local_1f0.
  super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pdVar15;
  for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
    data<float>::data(local_1f0.
                      super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    local_1f0.
    super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1f0.
         super__Vector_base<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (1 < number_of_parts) {
    this_00 = &pdVar15->_samples;
    uVar29 = uVar20;
    while (bVar34 = uVar29 != 0, uVar29 = uVar29 - 1, bVar34) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)(this_00 + -6) + 0x10),&main._channels);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)((long)(this_00 + -4) + 0x10),&main._results);
      *(PixelType *)(this_00 + 1) = main._type;
      std::
      vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
      ::resize(this_00,((long)main._samples.
                              super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)main._samples.
                             super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      this_00 = (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                 *)((long)(this_00 + 6) + 0x10);
    }
    pvVar18 = main._samples.
              super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar29 = 0;
        uVar29 < (ulong)(((long)main._samples.
                                super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18) / 0x18);
        uVar29 = uVar29 + 1) {
      lVar11 = 0;
      for (uVar30 = 0;
          uVar30 < (ulong)(((long)pvVar18[uVar29].
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)pvVar18[uVar29].
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar30 = uVar30 + 1) {
        iVar7 = random_int((int)uVar19);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::push_back(pdVar15[iVar7]._samples.
                    super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar29,
                    (value_type *)
                    ((long)&((main._samples.
                              super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar29].
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data + lVar11));
        lVar11 = lVar11 + 0x18;
        pvVar18 = main._samples.
                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if (uVar20 == 1) {
    data<float>::setHeader
              (&main,headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    lVar11 = 0;
    uVar19 = 0;
    if (0 < number_of_parts) {
      uVar19 = (ulong)(uint)number_of_parts;
    }
    pdVar21 = pdVar15;
    for (; uVar19 * 0x38 - lVar11 != 0; lVar11 = lVar11 + 0x38) {
      data<float>::setHeader
                (pdVar21,headers.
                         super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar11);
      pdVar21 = pdVar21 + 1;
    }
  }
  iVar7 = Imf_3_2::globalThreadCount();
  uVar19 = 0;
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (&f,(char *)local_2e0,
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,
             (int)(((long)headers.
                          super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)headers.
                         super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x38),false,iVar7);
  local_1d8 = pdVar15;
  uVar29 = (ulong)(uint)number_of_parts;
  if (number_of_parts < 1) {
    uVar29 = uVar19;
  }
  while( true ) {
    if (uVar19 == uVar29) break;
    Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
              ((DeepScanLineOutputPart *)local_208,&f,(int)uVar19);
    pdVar15 = pdVar15 + uVar19;
    local_2e0 = pdVar15;
    if (number_of_parts == 1) {
      local_2e0 = &main;
    }
    Imf_3_2::DeepScanLineOutputPart::header();
    piVar12 = (int *)Imf_3_2::Header::dataWindow();
    iVar7 = *piVar12;
    iVar8 = piVar12[1];
    iVar1 = piVar12[2];
    iVar10 = piVar12[3];
    iVar25 = (iVar1 - iVar7) + 1;
    if (iVar10 < iVar8 || iVar1 < iVar7) {
      iVar25 = 1;
    }
    iVar9 = (iVar10 - iVar8) + 1;
    if (iVar10 < iVar8 || iVar1 < iVar7) {
      iVar9 = 1;
    }
    pdVar21 = pdVar15;
    if (number_of_parts == 1) {
      pdVar21 = &main;
    }
    pvVar18 = (pdVar21->_samples).
              super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = ((long)(pdVar21->_samples).
                    super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18) / 0x18;
    ppvVar26 = (pointer *)
               ((long)&(pvVar18->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data + 8);
    lVar33 = 0;
    while (bVar34 = lVar11 != 0, lVar11 = lVar11 + -1, bVar34) {
      lVar33 = lVar33 + ((long)*ppvVar26 - (long)((_Vector_impl_data *)(ppvVar26 + -1))->_M_start) /
                        0x18;
      ppvVar26 = ppvVar26 + 3;
    }
    local_2e8 = (size_type)(iVar25 * iVar9);
    uVar30 = local_2e8 /
             (ulong)(((long)(pdVar21->_results).
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pdVar21->_results).
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&counts,local_2e8,(allocator_type *)&s);
    pdVar28 = local_2e0;
    pdVar32 = pdVar15;
    if (number_of_parts == 1) {
      pdVar32 = &main;
    }
    std::
    vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ::vector(&sample_pointers,
             (long)(pdVar32->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_2e0->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&s);
    local_1d0 = uVar19;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector(&sample_buffers,
             (long)(pdVar32->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pdVar28->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&s);
    lVar11 = 0;
    for (uVar19 = 0; pdVar28 = local_2e0,
        uVar19 < (ulong)(((long)sample_buffers.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sample_buffers.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar19 = uVar19 + 1) {
      std::vector<float_*,_std::allocator<float_*>_>::resize
                ((vector<float_*,_std::allocator<float_*>_> *)
                 ((long)&((sample_pointers.
                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar11),local_2e8);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&((sample_buffers.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar11),lVar33 * (uVar30 + 1));
      lVar11 = lVar11 + 0x18;
    }
    lVar11 = 0;
    lVar33 = 0;
    for (sVar24 = 0; sVar24 != local_2e8; sVar24 = sVar24 + 1) {
      pvVar18 = (pdVar21->_samples).
                super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = *(pointer *)
                ((long)&pvVar18[lVar11].
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      pvVar3 = pvVar18[lVar11].
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = ((long)pvVar2 - (long)pvVar3) / 0x18;
      counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar24] = (uint)lVar16;
      if (pvVar2 != pvVar3) {
        for (uVar19 = 0;
            uVar19 < (ulong)((long)(pdVar32->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_2e0->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar19 = uVar19 + 1) {
          pvVar18 = (pdVar21->_samples).
                    super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar31 = 0;
          lVar22 = lVar33;
          lVar27 = lVar16;
          while (bVar34 = lVar27 != 0, lVar27 = lVar27 + -1, bVar34) {
            sample_buffers.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar19].
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar22] =
                 *(float *)(*(long *)(*(long *)&pvVar18[lVar11].
                                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                ._M_impl.super__Vector_impl_data + lVar31) +
                           uVar19 * 4);
            lVar22 = lVar22 + 1;
            lVar31 = lVar31 + 0x18;
          }
          sample_pointers.
          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar19].
          super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar24] =
               sample_buffers.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19].
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar33;
        }
        lVar33 = lVar33 + lVar16;
      }
      lVar11 = lVar11 + 1;
      if (lVar11 == ((long)(pdVar21->_samples).
                           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pdVar21->_samples).
                          super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
        lVar11 = 0;
      }
    }
    poVar13 = std::operator<<((ostream *)&std::cout," wrote ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    poVar13 = std::operator<<(poVar13," samples  into ");
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::operator<<(poVar13," pixels\n");
    Imf_3_2::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&s);
    local_2e8 = (size_type)(iVar8 * iVar25);
    Imf_3_2::Slice::Slice
              ((Slice *)&data,UINT,
               (char *)(counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + (-(long)iVar7 - local_2e8)),4,
               (long)iVar25 * 4,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&s);
    local_2e8 = -local_2e8;
    if (number_of_parts == 1) {
      pdVar15 = &main;
    }
    lVar11 = 0;
    lVar33 = 0;
    for (uVar19 = 0;
        pbVar4 = (pdVar28->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar19 < (ulong)((long)(pdVar32->_channels).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5);
        uVar19 = uVar19 + 1) {
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)&data,pdVar15->_type,
                 (char *)(*(long *)((long)&((sample_pointers.
                                             super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<float_*,_std::allocator<float_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar11) +
                          (long)iVar7 * -8 + local_2e8 * 8),8,(long)iVar25 << 3,4,1,1,0.0,false,
                 false);
      Imf_3_2::DeepFrameBuffer::insert
                ((string *)&s,(DeepSlice *)((long)&(pbVar4->_M_dataplus)._M_p + lVar33));
      lVar33 = lVar33 + 0x20;
      lVar11 = lVar11 + 0x18;
      pdVar28 = local_2e0;
    }
    Imf_3_2::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_208);
    Imf_3_2::DeepScanLineOutputPart::writePixels((int)(DeepFrameBuffer *)local_208);
    uVar19 = local_1d0;
    pdVar15 = local_1d8;
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                 *)&s);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&sample_buffers);
    std::
    vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ::~vector(&sample_pointers);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    uVar19 = uVar19 + 1;
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&f);
  std::
  vector<(anonymous_namespace)::data<float>,_std::allocator<(anonymous_namespace)::data<float>_>_>::
  ~vector(&local_1f0);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Imf_3_2::CompositeDeepScanLine::CompositeDeepScanLine((CompositeDeepScanLine *)&sample_pointers);
  _Var6 = fn._M_dataplus;
  local_1a0._0_4_ = _S_red;
  local_1a0._8_8_ = 0;
  local_1a0._16_8_ = local_1a0;
  local_180 = 0;
  local_188 = (_Base_ptr)local_1a0._16_8_;
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&sample_buffers,_Var6._M_p,iVar7,true);
  std::vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>::
  vector((vector<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
          *)&counts,uVar20,(allocator_type *)&headers);
  for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
    this = (DeepScanLineInputPart *)operator_new(8);
    Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
              (this,(MultiPartInputFile *)&sample_buffers,(int)uVar20);
    *(DeepScanLineInputPart **)
     (counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start + uVar20 * 2) = this;
    Imf_3_2::CompositeDeepScanLine::addSource((DeepScanLineInputPart *)&sample_pointers);
  }
  pBVar17 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<float>::setUpFrameBuffer(&main,&data,(FrameBuffer *)&s,pBVar17,load_depths);
  Imf_3_2::CompositeDeepScanLine::setFrameBuffer((FrameBuffer *)&sample_pointers);
  if (entire_buffer) {
    lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar7 = *(int *)(lVar11 + 4);
    Imf_3_2::CompositeDeepScanLine::dataWindow();
    Imf_3_2::CompositeDeepScanLine::readPixels((int)&sample_pointers,iVar7);
  }
  else {
    lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
    iVar7 = *(int *)(lVar11 + 4);
    while (lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow(), iVar7 < *(int *)(lVar11 + 0xc)) {
      iVar8 = random_int(0x40);
      lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
      iVar8 = iVar8 + iVar7;
      if (*(int *)(lVar11 + 0xc) < iVar8) {
        lVar11 = Imf_3_2::CompositeDeepScanLine::dataWindow();
        iVar8 = *(int *)(lVar11 + 0xc);
      }
      Imf_3_2::CompositeDeepScanLine::readPixels((int)&sample_pointers,iVar7);
      iVar7 = iVar8;
    }
  }
  pBVar17 = (Box2i *)Imf_3_2::CompositeDeepScanLine::dataWindow();
  data<float>::checkValues(&main,&data,pBVar17,load_depths);
  for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
    operator_delete(*(void **)(counts.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar20 * 2),8);
  }
  std::
  _Vector_base<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
  ::~_Vector_base((_Vector_base<Imf_3_2::DeepScanLineInputPart_*,_std::allocator<Imf_3_2::DeepScanLineInputPart_*>_>
                   *)&counts);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&sample_buffers);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&s);
  Imf_3_2::CompositeDeepScanLine::~CompositeDeepScanLine((CompositeDeepScanLine *)&sample_pointers);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data.super__Vector_base<float,_std::allocator<float>_>);
  _Var6 = fn._M_dataplus;
  if (number_of_parts == 1) {
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)&counts,_Var6._M_p,iVar7);
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_1a0._0_4_ = _S_red;
    local_1a0._8_8_ = 0;
    local_1a0._16_8_ = local_1a0;
    local_180 = 0;
    local_188 = (_Base_ptr)local_1a0._16_8_;
    Imf_3_2::InputFile::header();
    pBVar17 = (Box2i *)Imf_3_2::Header::dataWindow();
    data<float>::setUpFrameBuffer(&main,&data,(FrameBuffer *)&s,pBVar17,load_depths);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&counts);
    iVar7 = (pBVar17->min).y;
    if (entire_buffer) {
      Imf_3_2::InputFile::readPixels((int)&counts,iVar7);
    }
    else {
      while (iVar7 < (pBVar17->max).y) {
        iVar10 = random_int(0x40);
        iVar8 = (pBVar17->max).y;
        iVar1 = iVar10 + iVar7;
        if (iVar8 <= iVar10 + iVar7) {
          iVar1 = iVar8;
        }
        Imf_3_2::InputFile::readPixels((int)&counts,iVar7);
        iVar7 = iVar1;
      }
    }
    data<float>::checkValues(&main,&data,pBVar17,load_depths);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&s);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&data.super__Vector_base<float,_std::allocator<float>_>);
    Imf_3_2::InputFile::~InputFile((InputFile *)&counts);
  }
  remove(fn._M_dataplus._M_p);
  data<float>::~data(&main);
  std::__cxx11::string::~string((string *)&fn);
  return;
}

Assistant:

void
test_parts (
    int                pattern_number,
    int                number_of_parts,
    bool               load_depths,
    bool               entire_buffer,
    const std::string& tempDir)
{
    std::string fn = tempDir + "imf_test_composite_deep_scanline_source.exr";

    data<T> main;
    make_pattern (main, pattern_number);
    write_file (fn.c_str (), main, number_of_parts);

    {
        vector<T>                      data;
        CompositeDeepScanLine          comp;
        FrameBuffer                    testbuf;
        MultiPartInputFile             input (fn.c_str ());
        vector<DeepScanLineInputPart*> parts (number_of_parts);

        // use 'part' interface TODO test file interface too
        for (int i = 0; i < number_of_parts; i++)
        {
            parts[i] = new DeepScanLineInputPart (input, i);
            comp.addSource (parts[i]);
        }

        main.setUpFrameBuffer (
            data, testbuf, comp.dataWindow (), load_depths);

        comp.setFrameBuffer (testbuf);

        //
        // try loading the whole buffer
        //
        if (entire_buffer)
        {
            comp.readPixels (
                comp.dataWindow ().min.y, comp.dataWindow ().max.y);
        }
        else
        {
            int low = comp.dataWindow ().min.y;
            while (low < comp.dataWindow ().max.y)
            {
                int high = low + random_int (64);
                if (high > comp.dataWindow ().max.y)
                    high = comp.dataWindow ().max.y;
                comp.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, comp.dataWindow (), load_depths);

        for (int i = 0; i < number_of_parts; i++)
        {
            delete parts[i];
        }
    }
    if (number_of_parts == 1)
    {
        // also test InputFile interface
        InputFile    file (fn.c_str ());
        vector<T>    data;
        FrameBuffer  testbuf;
        const Box2i& dataWindow = file.header ().dataWindow ();
        main.setUpFrameBuffer (data, testbuf, dataWindow, load_depths);
        file.setFrameBuffer (testbuf);
        if (entire_buffer)
        {
            file.readPixels (dataWindow.min.y, dataWindow.max.y);
        }
        else
        {
            int low = dataWindow.min.y;
            while (low < dataWindow.max.y)
            {
                int high = low + random_int (64);
                if (high > dataWindow.max.y) high = dataWindow.max.y;
                file.readPixels (low, high);
                low = high;
            }
        }

        main.checkValues (data, dataWindow, load_depths);
    }
    remove (fn.c_str ());
}